

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O1

SampledSpectrum __thiscall
pbrt::CloudMediumProvider::Density(CloudMediumProvider *this,Point3f p,SampledWavelengths *param_2)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  int iVar3;
  CloudMediumProvider *this_00;
  undefined1 auVar4 [16];
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  Point3f p_00;
  Point3f p_01;
  undefined1 auVar8 [64];
  undefined1 extraout_var [60];
  Vector3f VVar14;
  
  auVar7._8_56_ = p._8_56_;
  auVar7._0_8_ = p.super_Tuple3<pbrt::Point3,_float>._0_8_;
  fVar10 = this->frequency;
  fVar12 = fVar10 * p.super_Tuple3<pbrt::Point3,_float>.x;
  fVar13 = fVar10 * p.super_Tuple3<pbrt::Point3,_float>.y;
  fVar10 = fVar10 * p.super_Tuple3<pbrt::Point3,_float>.z;
  this_00 = this;
  if (0.0 < this->wispiness) {
    fVar9 = this->wispiness * 0.05;
    fVar5 = 10.0;
    iVar3 = 1;
    do {
      p_00.super_Tuple3<pbrt::Point3,_float>.x = fVar12 * fVar5;
      p_00.super_Tuple3<pbrt::Point3,_float>.y = fVar13 * fVar5;
      p_00.super_Tuple3<pbrt::Point3,_float>.z = fVar10 * fVar5;
      VVar14 = DNoise(p_00);
      fVar12 = fVar12 + fVar9 * VVar14.super_Tuple3<pbrt::Vector3,_float>.x;
      fVar13 = fVar13 + fVar9 * VVar14.super_Tuple3<pbrt::Vector3,_float>.y;
      fVar10 = fVar10 + fVar9 * VVar14.super_Tuple3<pbrt::Vector3,_float>.z;
      fVar9 = fVar9 * 0.5;
      fVar5 = fVar5 * 1.99;
      iVar3 = iVar3 + -1;
    } while (iVar3 == 0);
  }
  fVar5 = 1.0;
  fVar9 = 0.5;
  iVar3 = 5;
  auVar4 = ZEXT816(0) << 0x40;
  do {
    p_01.super_Tuple3<pbrt::Point3,_float>.x = fVar12 * fVar5;
    p_01.super_Tuple3<pbrt::Point3,_float>.y = fVar13 * fVar5;
    p_01.super_Tuple3<pbrt::Point3,_float>.z = fVar10 * fVar5;
    auVar8._0_4_ = Noise((pbrt *)this_00,p_01);
    auVar8._4_60_ = extraout_var;
    auVar4 = vfmadd231ss_fma(ZEXT416(auVar4._0_4_),ZEXT416((uint)fVar9),auVar8._0_16_);
    fVar9 = fVar9 * 0.5;
    fVar5 = fVar5 * 1.99;
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  auVar6 = vmovshdup_avx(auVar7._0_16_);
  auVar11 = ZEXT816(0);
  auVar1 = vmaxss_avx(ZEXT416((uint)(0.5 - auVar6._0_4_)),auVar11);
  auVar6 = ZEXT416((uint)(auVar4._0_4_ * (1.0 - auVar6._0_4_) * 4.5 * this->density));
  auVar4 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar6);
  uVar2 = vcmpss_avx512f(auVar6,auVar11,1);
  auVar4._0_4_ = (uint)!(bool)((byte)uVar2 & 1) * auVar4._0_4_;
  auVar1 = vfmadd231ss_fma(auVar4,auVar1,ZEXT416(0x40000000));
  auVar4 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar1);
  uVar2 = vcmpss_avx512f(auVar1,auVar11,1);
  iVar3 = (uint)!(bool)((byte)uVar2 & 1) * auVar4._0_4_;
  return (array<float,_4>)CONCAT88(CONCAT44((float)iVar3,(float)iVar3),CONCAT44(iVar3,iVar3));
}

Assistant:

Density(Point3f p, const SampledWavelengths &) const {
        Point3f pp = frequency * p;
        if (wispiness > 0) {
            // Perturb cloud lookup point _pp_ using noise
            Float vomega = .05f * wispiness, vlambda = 10.f;
            for (int i = 0; i < 2; ++i) {
                pp += vomega * DNoise(vlambda * pp);
                vomega *= 0.5f;
                vlambda *= 1.99f;
            }
        }
        // Sum scales of noise to approximate cloud density
        Float d = 0;
        Float omega = .5, lambda = 1.f;
        for (int i = 0; i < 5; ++i) {
            d += omega * Noise(lambda * pp);
            omega *= 0.5f;
            lambda *= 1.99f;
        }

        // Model decrease in density with altitude and return final cloud density
        d = Clamp((1 - p.y) * 4.5f * density * d, 0, 1);
        d += 2 * std::max<Float>(0, .5f - p.y);
        return SampledSpectrum(Clamp(d, 0, 1));
    }